

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O1

int Doolittle8(uchar *mat,int *pivot,int n)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  char cVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  uint uVar22;
  bool bVar23;
  ulong local_98;
  ulong local_88;
  ulong local_80;
  ulong local_48;
  ulong uVar4;
  
  uVar5 = n - 1;
  iVar20 = n;
  if (n < 0) {
    iVar20 = n + 7;
  }
  uVar3 = iVar20 >> 3;
  uVar4 = (ulong)uVar3;
  lVar12 = (long)(int)uVar3;
  uVar8 = (ulong)(uint)n;
  local_80 = 0;
  uVar13 = 0;
  if (0 < (int)uVar5) {
    uVar13 = (ulong)uVar5;
  }
  local_88 = 1;
  local_98 = 0;
  uVar1 = local_98;
  local_48 = uVar4;
  do {
    local_98 = uVar1;
    if (local_98 == uVar13) goto LAB_0010571f;
    uVar16 = (uint)local_98;
    pivot[local_98] = uVar16;
    uVar1 = local_98 + 1;
    if (uVar1 < uVar8) {
      uVar21 = local_98 >> 3 & 0x1fffffff;
      uVar10 = local_88;
      uVar14 = local_48;
      do {
        bVar23 = ((~(uint)mat[uVar21 + local_98 * lVar12] &
                  (uint)mat[(uint)uVar10 * uVar3 + (int)uVar21]) >> (~uVar16 & 7) & 1) != 0;
        if (7 < n) {
          uVar18 = 0;
          do {
            uVar19 = (int)uVar14 + (int)uVar18;
            bVar2 = mat[uVar19];
            bVar9 = (byte)-(uint)bVar23;
            mat[uVar19] = mat[uVar18 + local_80] & bVar9 | bVar23 - 1U & bVar2;
            mat[uVar18 + local_80] = bVar2 & bVar9 | mat[uVar18 + local_80] & bVar23 - 1U;
            uVar18 = uVar18 + 1;
          } while (uVar4 != uVar18);
        }
        uVar19 = 0;
        if (!bVar23) {
          uVar19 = pivot[local_98];
        }
        pivot[local_98] = -(uint)bVar23 & (uint)uVar10 | uVar19;
        uVar10 = uVar10 + 1;
        uVar14 = uVar14 + uVar4;
      } while (uVar10 != uVar8);
    }
    iVar6 = uVar16 * n;
    iVar20 = iVar6 + 7;
    if (-1 < iVar6) {
      iVar20 = iVar6;
    }
    uVar19 = (uint)(local_98 >> 3) & 0x1fffffff;
    uVar22 = 1 << (~(byte)local_98 & 7);
    bVar2 = mat[(int)((iVar20 >> 3) + uVar19)];
    if ((bVar2 >> (~(byte)local_98 & 7) & 1) == 0) break;
    if ((long)uVar1 < (long)n) {
      uVar7 = (uint)uVar1 & 7;
      uVar14 = uVar1 >> 3 & 0x1fffffff;
      cVar11 = (char)(0x100 >> (sbyte)uVar7);
      uVar10 = local_88;
      do {
        iVar6 = (int)uVar10 * n;
        iVar20 = iVar6 + 7;
        if (-1 < iVar6) {
          iVar20 = iVar6;
        }
        lVar15 = uVar10 * lVar12;
        uVar17 = mat[(int)((iVar20 >> 3) + uVar19)] & uVar22;
        bVar9 = mat[uVar14 + local_98 * lVar12];
        if (uVar17 == 0) {
          bVar9 = (byte)uVar17;
        }
        mat[lVar15 + uVar14] =
             (bVar9 ^ mat[lVar15 + uVar14]) & cVar11 - 1U | mat[lVar15 + uVar14] & -cVar11;
        for (iVar20 = (uVar16 - uVar7) + 9; iVar20 < n; iVar20 = iVar20 + 8) {
          iVar6 = iVar20 + 7;
          if (-1 < iVar20) {
            iVar6 = iVar20;
          }
          bVar9 = mat[(long)(iVar6 >> 3) + local_98 * lVar12];
          if (uVar17 == 0) {
            bVar9 = 0;
          }
          mat[(iVar6 >> 3) + lVar15] = mat[(iVar6 >> 3) + lVar15] ^ bVar9;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != uVar8);
    }
    local_88 = local_88 + 1;
    local_80 = (ulong)((int)local_80 + uVar3);
    local_48 = local_48 + uVar4;
  } while ((bVar2 & uVar22) != 0);
  iVar20 = -1;
  if ((long)(int)uVar5 <= (long)local_98) {
LAB_0010571f:
    pivot[(int)uVar5] = uVar5;
    iVar20 = n + 7;
    if (-1 < n) {
      iVar20 = n;
    }
    iVar20 = (mat[(long)((iVar20 >> 3) * n) + -1] & 1) - 1;
  }
  return iVar20;
}

Assistant:

int Doolittle8(unsigned char *mat, int *pivot, int n)
{

  /* LU pseudo code (inplace, without pivoting)
      // n-1 Iterationsschritte
      for k := 1 to n-1
       // Zeilen der Restmatrix werden durchlaufen
       for i := k+1 to n
         // Berechnung von L
         A(i,k) := A(i,k) / A(k,k) // Achtung: vorher Prüfung auf Nullwerte notwendig
         // Spalten der Restmatrix werden durchlaufen
         for j := k+1 to n
           // Berechnung von R
           A(i,j) := A(i,j) - A(i,k) * A(k,j)
   */

  for(int k = 0; k < n-1; k++)
  {

    /*
     * swap rows in constant time ...
     */

    pivot[k] = k;

    unsigned char tmp;
    for(unsigned int j = k+1; j < n; j++)
    {
      unsigned int mask_cpy = (mat[(n/8)*j + k/8] >> (7 - (k % 8))) & 1; // note: type has to be large enough to use as mask with j in pivot computing
      mask_cpy = mask_cpy & !((mat[(n/8)*k + k/8] >> (7 - (k % 8))) & 1);  // add this in order to only actually switch with the first suitable row => consistent with "ref" non-constant-time impl
      mask_cpy = -mask_cpy;
      for(int c = 0; c < n/8; c++)
      {
        tmp = mat[(n/8)*j + c];
        mat[(n/8)*j + c] = (mat[(n/8)*j + c] & ~mask_cpy) | (mat[(n/8)*k + c] & mask_cpy);
        mat[(n/8)*k + c] = (mat[(n/8)*k + c] & ~mask_cpy) | (tmp & mask_cpy);
      }

      // update pivot
      pivot[k] = (j & mask_cpy) | (pivot[k] & ~mask_cpy);
    }

    if (!((mat[k*n/8 + (k/8)] >> (7 - (k % 8))) & 1))
    {
      return -1;
    }

    // for i := k+1 to n
    //      for j := k+1 to n
    //          A(i,j) := A(i,j) - A(i,k) * A(k,j)
    //
    // Bitwise: A(i,j) := A(i,j) ^ A(i,k) & A(k,j)
    // idea: take element A(i,k). It's either 0 or 1. Expand to 8 bits. Multiply with A(k,j), ... A(k,j+7)
    // basically, bit A(i,k) decides whether row A(k) (starting from the k+1'th column) is added to the i+1'th, ..., n'th rows below
    // use a mask for constant time instead of if(bit==1)


    for(int i = k+1; i < n; i++)
    {
      // 0x00 iff A(i,k) is zero. Otherweise 0xFF
      unsigned char mask_ik = 0x00 - ((mat[i*n/8 + (k/8)] >> (7 - (k % 8))) & 1);

      /*
       * First, handle the case that j = k+1 is not divisible by 8; i.e. only handle the last j%8 bits of this byte
       */
      unsigned char mask_prepending = (unsigned char) (0x100 >> ((k+1) % 8)) - 1;

      unsigned char tmp = mat[n/8*i + (k+1)/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      mat[i*(n/8) + (k+1)/8]  ^= (mask_ik & mat[k*(n/8) + (k+1)/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      mat[n/8*i + (k+1)/8] &= mask_prepending;
      mat[n/8*i + (k+1)/8] |= tmp;


      /*
       * now handle the rest of the row efficiently in byte-aligned byte-chunks
       */
      for(int j = k+1 + (8-((k+1)%8)); j < n; j += 8)
      {
        // A(i,j) = A(i,j) + mask_ik * A(k,j)
        // => XOR Bits A(i,j) ... A(i,j+7) with (mask_ik & (A(k,j), ... A(k,j+7))
        mat[i*(n/8) + j/8] ^= mask_ik & mat[k*(n/8) + j/8];
      }
    }
  }
  pivot[n-1] = n-1;

  if ((mat[(n/8)*(n-1) + n/8-1] & 0x01) == 0)
  {
    return -1;
  }
  return 0;
}